

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

bool __thiscall implementations::scheme::SchemeFrame::resolveArgument(SchemeFrame *this,cell *value)

{
  map *this_00;
  SchemeFrame *this_01;
  env_p local_28;
  
  if (value->type == List) {
    if ((value->list).
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (value->list).
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (SchemeFrame *)operator_new(0x138);
      local_28.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this->
               super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
               ).env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_28.super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->
           super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
           ).env.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_28.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_28.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_28.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_28.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_28.
                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SchemeFrame(this_01,value,&local_28);
      this->subframe = this_01;
      if (local_28.
          super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.
                   super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      this->subframe_mode = Argument;
      return false;
    }
  }
  else if (value->type == Symbol) {
    this_00 = environment::find((this->
                                super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                                ).env.
                                super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,&value->val);
    value = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
            ::operator[](this_00,&value->val);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  push_back(&this->resolved_arguments,value);
  return true;
}

Assistant:

bool resolveArgument(const cell &value) {
		switch (value.type) {
		case Symbol:
			resolved_arguments.push_back(lookup(value.val));
			DEBUG(std::string("  resolveArgument(") + to_string(value) + std::string(") = ") + to_string(lookup(value.val)));
			return true;
		case List:
			if (value.list.empty()) {
				resolved_arguments.push_back(value);
				return true;
			}
			// Function call. Create frame to execute it.
			subframe = new SchemeFrame(value, env);
			subframe_mode = Argument;
			return false;
		default:
			DEBUG(std::string("  resolveArgument(") + to_string(value) + std::string(") = ") + to_string(value));
			resolved_arguments.push_back(value);
			return true;
		}
	}